

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hulog.cpp
# Opt level: O3

void log_print_callstack(FILE *f,int callstack_depth,void **callstack)

{
  void *pvVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  _Rb_tree_header *p_Var5;
  char *__s;
  size_t sVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  ulong uVar9;
  ulong uVar10;
  _Base_ptr p_Var11;
  ulong uVar12;
  ulong uVar13;
  uint __len;
  int status;
  string symbol;
  Dl_info dlinfo;
  int local_a4;
  undefined2 *local_a0;
  undefined8 local_98;
  undefined2 local_90;
  undefined1 local_8e;
  undefined1 local_8d;
  undefined1 *local_80;
  long local_78;
  undefined1 local_70 [16];
  ulong local_60;
  void *local_58;
  undefined1 local_50 [16];
  char *local_40;
  long local_38;
  
  if (callstack_depth < 1) {
    fprintf((FILE *)f,"==%d==    error: backtrace() returned empty callstack\n",(ulong)(uint)pid);
    return;
  }
  if (callstack_depth != 1) {
    uVar10 = (ulong)(uint)callstack_depth;
    uVar12 = 1;
    local_60 = uVar10;
    do {
      fprintf((FILE *)f,"==%d==    at 0x%016lx",(ulong)(uint)pid,callstack[uVar12]);
      if (hu_log_nosyms == 0) {
        pvVar1 = callstack[uVar12];
        local_80 = local_70;
        local_78 = 0;
        local_70[0] = 0;
        p_Var8 = (symbol_cache_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_58 = pvVar1;
        if (p_Var8 == (_Base_ptr)0x0) {
LAB_00107395:
          iVar4 = dladdr(pvVar1,local_50);
          if (local_40 != (char *)0x0 && iVar4 != 0) {
            if (*local_40 == '_') {
              local_a4 = -1;
              __s = (char *)__cxa_demangle(local_40,0,0,&local_a4);
              if (__s != (char *)0x0) {
                if (local_a4 == 0) {
                  local_a0 = &local_90;
                  sVar6 = strlen(__s);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_a0,__s,__s + sVar6);
                  std::__cxx11::string::operator=((string *)&local_80,(string *)&local_a0);
                  if (local_a0 != &local_90) {
                    operator_delete(local_a0);
                  }
                }
                free(__s);
              }
            }
            if (local_78 == 0) {
              std::__cxx11::string::string((string *)&local_a0,local_40,(allocator *)&local_a4);
              std::__cxx11::string::operator=((string *)&local_80,(string *)&local_a0);
              if (local_a0 != &local_90) {
                operator_delete(local_a0);
              }
              if (local_78 == 0) goto LAB_001075b4;
            }
            local_8e = 0x20;
            local_90 = 0x2b20;
            local_98 = 3;
            local_8d = 0;
            local_a0 = &local_90;
            std::__cxx11::string::_M_append((char *)&local_80,(ulong)&local_90);
            if (local_a0 != &local_90) {
              operator_delete(local_a0);
            }
            uVar13 = (long)pvVar1 - local_38;
            uVar10 = -uVar13;
            if (0 < (long)uVar13) {
              uVar10 = uVar13;
            }
            __len = 1;
            if (9 < uVar10) {
              uVar9 = uVar10;
              uVar3 = 4;
              do {
                __len = uVar3;
                if (uVar9 < 100) {
                  __len = __len - 2;
                  goto LAB_00107556;
                }
                if (uVar9 < 1000) {
                  __len = __len - 1;
                  goto LAB_00107556;
                }
                if (uVar9 < 10000) goto LAB_00107556;
                bVar2 = 99999 < uVar9;
                uVar9 = uVar9 / 10000;
                uVar3 = __len + 4;
              } while (bVar2);
              __len = __len + 1;
            }
LAB_00107556:
            local_a0 = &local_90;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_a0,(char)__len - (char)((long)uVar13 >> 0x3f));
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)((long)local_a0 - ((long)uVar13 >> 0x3f)),__len,uVar10);
            std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_a0);
            if (local_a0 != &local_90) {
              operator_delete(local_a0);
            }
          }
LAB_001075b4:
          pmVar7 = std::
                   map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](symbol_cache_abi_cxx11_,&local_58);
          std::__cxx11::string::_M_assign((string *)pmVar7);
        }
        else {
          p_Var5 = &(symbol_cache_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header;
          p_Var11 = &p_Var5->_M_header;
          do {
            if (*(void **)(p_Var8 + 1) >= pvVar1) {
              p_Var11 = p_Var8;
            }
            p_Var8 = (&p_Var8->_M_left)[*(void **)(p_Var8 + 1) < pvVar1];
          } while (p_Var8 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var11 == p_Var5) || (pvVar1 < *(void **)(p_Var11 + 1)))
          goto LAB_00107395;
          std::__cxx11::string::_M_assign((string *)&local_80);
        }
        uVar10 = local_60;
        fprintf((FILE *)f,": %s\n",local_80);
        if (local_80 != local_70) {
          operator_delete(local_80);
        }
      }
      else {
        fputc(10,(FILE *)f);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar10);
  }
  return;
}

Assistant:

void log_print_callstack(FILE *f, int callstack_depth, void * const callstack[])
{
  if (callstack_depth > 0)
  {
    int i = 1;
    while (i < callstack_depth)
    {
#if UINTPTR_MAX == 0xffffffff
      fprintf(f, "==%d==    at 0x%08x", pid, (unsigned int) callstack[i]);
#else
      fprintf(f, "==%d==    at 0x%016" PRIxPTR, pid, (unsigned long) callstack[i]);
#endif

      if (hu_log_nosyms)
      {
        fprintf(f, "\n");
      }
      else
      {
        std::string symbol = addr_to_symbol(callstack[i]);
        fprintf(f, ": %s\n", symbol.c_str());
      }

      ++i;
    }
  }
  else
  {
    fprintf(f, "==%d==    error: backtrace() returned empty callstack\n", pid);
  }
}